

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O3

bool __thiscall
ithipublisher::FinishCCdataM10
          (ithipublisher *this,FILE *F,bool is_svc_list_open,bool *sub_metric_found,
          char **sub_met_name)

{
  int iVar1;
  char *pcVar2;
  undefined7 in_register_00000011;
  bool bVar3;
  int i;
  long lVar4;
  
  bVar3 = true;
  if ((int)CONCAT71(in_register_00000011,is_svc_list_open) != 0) {
    iVar1 = fprintf((FILE *)F,"]");
    bVar3 = 0 < iVar1;
    sub_metric_found[3] = true;
  }
  lVar4 = 0;
  do {
    if (sub_metric_found[lVar4] == false) {
      pcVar2 = "0";
      if (lVar4 == 3) {
        pcVar2 = "[]";
      }
      iVar1 = fprintf((FILE *)F,",\n\"%s\": %s",sub_met_name[lVar4],pcVar2);
      bVar3 = (bool)(bVar3 & 0 < iVar1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  iVar1 = fprintf((FILE *)F,"}");
  return (bool)(0 < iVar1 & bVar3);
}

Assistant:

bool ithipublisher::FinishCCdataM10(FILE* F, bool is_svc_list_open, bool sub_metric_found[5], char const * sub_met_name[5])
{
    bool ret = true;
    if (is_svc_list_open)
    {
        if (is_svc_list_open) {
            ret &= fprintf(F, "]") > 0;
        }
        sub_metric_found[3] = true;
    }
    for (int i = 0; i < 5; i++) {
        if (sub_metric_found[i]) {
            continue;
        }
        ret &= fprintf(F, ",\n\"%s\": %s", sub_met_name[i], (i == 3) ? "[]" : "0") > 0;
    }
    ret &= fprintf(F, "}") > 0;
    return ret;
}